

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void printKTX2Header(KTX_header2 *pHeader)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  fwrite("identifier: ",0xc,1,_stdout);
  printIdentifier(pHeader->identifier,false);
  fputc(10,_stdout);
  pcVar3 = vkFormatString(pHeader->vkFormat);
  iVar2 = strcmp(pcVar3,"VK_UNKNOWN_FORMAT");
  if (iVar2 == 0) {
    fprintf(_stdout,"vkFormat: 0x%08X\n",(ulong)pHeader->vkFormat);
  }
  else {
    fprintf(_stdout,"vkFormat: %s\n",pcVar3);
  }
  fprintf(_stdout,"typeSize: %u\n",(ulong)pHeader->typeSize);
  fprintf(_stdout,"pixelWidth: %u\n",(ulong)pHeader->pixelWidth);
  fprintf(_stdout,"pixelHeight: %u\n",(ulong)pHeader->pixelHeight);
  fprintf(_stdout,"pixelDepth: %u\n",(ulong)pHeader->pixelDepth);
  fprintf(_stdout,"layerCount: %u\n",(ulong)pHeader->layerCount);
  fprintf(_stdout,"faceCount: %u\n",(ulong)pHeader->faceCount);
  fprintf(_stdout,"levelCount: %u\n",(ulong)pHeader->levelCount);
  pcVar3 = ktxSupercompressionSchemeString(pHeader->supercompressionScheme);
  iVar2 = strcmp(pcVar3,"Invalid scheme value");
  if (iVar2 == 0) {
    uVar1 = pHeader->supercompressionScheme;
    pcVar3 = "supercompressionScheme: Invalid scheme (0x%X)\n";
  }
  else {
    iVar2 = strcmp(pcVar3,"Vendor or reserved scheme");
    if (iVar2 != 0) {
      fprintf(_stdout,"supercompressionScheme: %s\n",pcVar3);
      goto LAB_001d52aa;
    }
    uVar1 = pHeader->supercompressionScheme;
    pcVar3 = "supercompressionScheme: Vendor or reserved scheme (0x%X)\n";
  }
  fprintf(_stdout,pcVar3,(ulong)uVar1);
LAB_001d52aa:
  fprintf(_stdout,"dataFormatDescriptor.byteOffset: %#x\n",
          (ulong)(pHeader->dataFormatDescriptor).byteOffset);
  fprintf(_stdout,"dataFormatDescriptor.byteLength: %u\n",
          (ulong)(pHeader->dataFormatDescriptor).byteLength);
  fprintf(_stdout,"keyValueData.byteOffset: %#x\n",(ulong)(pHeader->keyValueData).byteOffset);
  fprintf(_stdout,"keyValueData.byteLength: %u\n",(ulong)(pHeader->keyValueData).byteLength);
  fprintf(_stdout,"supercompressionGlobalData.byteOffset: %#lx\n",
          (pHeader->supercompressionGlobalData).byteOffset);
  fprintf(_stdout,"supercompressionGlobalData.byteLength: %ld\n",
          (pHeader->supercompressionGlobalData).byteLength);
  return;
}

Assistant:

void
printKTX2Header(KTX_header2* pHeader)
{
    fprintf(stdout, "identifier: ");
    printIdentifier(pHeader->identifier, false);
    fprintf(stdout, "\n");
    const char* vkFormatStr = vkFormatString(pHeader->vkFormat);
    if (strcmp(vkFormatStr, "VK_UNKNOWN_FORMAT") == 0)
        fprintf(stdout, "vkFormat: 0x%08X\n", (uint32_t) pHeader->vkFormat);
    else
        fprintf(stdout, "vkFormat: %s\n", vkFormatStr);
    fprintf(stdout, "typeSize: %u\n", pHeader->typeSize);
    fprintf(stdout, "pixelWidth: %u\n", pHeader->pixelWidth);
    fprintf(stdout, "pixelHeight: %u\n", pHeader->pixelHeight);
    fprintf(stdout, "pixelDepth: %u\n", pHeader->pixelDepth);
    fprintf(stdout, "layerCount: %u\n",
            pHeader->layerCount);
    fprintf(stdout, "faceCount: %u\n", pHeader->faceCount);
    fprintf(stdout, "levelCount: %u\n", pHeader->levelCount);
    const char* scSchemeStr = ktxSupercompressionSchemeString(pHeader->supercompressionScheme);
    if (strcmp(scSchemeStr, "Invalid scheme value") == 0)
        fprintf(stdout, "supercompressionScheme: Invalid scheme (0x%X)\n", (uint32_t) pHeader->supercompressionScheme);
    else if (strcmp(scSchemeStr, "Vendor or reserved scheme") == 0)
        fprintf(stdout, "supercompressionScheme: Vendor or reserved scheme (0x%X)\n", (uint32_t) pHeader->supercompressionScheme);
    else
        fprintf(stdout, "supercompressionScheme: %s\n", scSchemeStr);
    fprintf(stdout, "dataFormatDescriptor.byteOffset: %#x\n",
            pHeader->dataFormatDescriptor.byteOffset);
    fprintf(stdout, "dataFormatDescriptor.byteLength: %u\n",
            pHeader->dataFormatDescriptor.byteLength);
    fprintf(stdout, "keyValueData.byteOffset: %#x\n", pHeader->keyValueData.byteOffset);
    fprintf(stdout, "keyValueData.byteLength: %u\n", pHeader->keyValueData.byteLength);
    fprintf(stdout, "supercompressionGlobalData.byteOffset: %#" PRIx64 "\n",
            pHeader->supercompressionGlobalData.byteOffset);
    fprintf(stdout, "supercompressionGlobalData.byteLength: %" PRId64 "\n",
            pHeader->supercompressionGlobalData.byteLength);
}